

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

bool cmTargetLinkLibrariesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer puVar2;
  pointer pbVar3;
  cmTarget *this;
  bool bVar4;
  __type _Var5;
  TargetType TVar6;
  PolicyStatus PVar7;
  int iVar8;
  cmake *pcVar9;
  ostream *poVar10;
  string *psVar11;
  cmMakefile *pcVar12;
  size_type sVar13;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  cmValue cVar14;
  undefined8 uVar15;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  MessageType t;
  pointer puVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__u;
  long lVar17;
  size_type pos;
  pointer __pos;
  ulong uVar18;
  char *pcVar19;
  basic_string_view<char,_std::char_traits<char>_> str;
  ulong uStackY_2e0;
  bool haveLLT;
  ProcessingState currentProcessingState;
  ulong local_2c0;
  allocator<char> local_2b2;
  allocator<char> local_2b1;
  cmMakefile *local_2b0;
  undefined1 local_2a1;
  undefined1 local_2a0;
  undefined1 local_29f;
  allocator<char> local_29e;
  allocator<char> local_29d;
  allocator<char> local_29c;
  allocator<char> local_29b;
  allocator<char> local_29a;
  allocator<char> local_299;
  size_t genexNesting;
  cmTarget *local_290;
  allocator<char> local_288 [32];
  TLL tll;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  currentEntry;
  ostringstream e;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  undefined1 local_b0 [88];
  anon_class_40_5_a08604cb processCurrentEntry;
  
  psVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (psVar11 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments",(allocator<char> *)&tll);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_0025336f:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  pcVar1 = status->Makefile;
  bVar4 = cmMakefile::IsAlias(pcVar1,psVar11);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"can not be used on an ALIAS target.",(allocator<char> *)&tll);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_0025336f;
  }
  pcVar9 = cmMakefile::GetCMakeInstance(pcVar1);
  local_290 = cmGlobalGenerator::FindTarget
                        ((pcVar9->GlobalGenerator)._M_t.
                         super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                         .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,false);
  if (local_290 == (cmTarget *)0x0) {
    puVar2 = (pcVar1->ImportedTargetsOwned).
             super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pcVar1->ImportedTargetsOwned).
                   super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar2;
        puVar16 = puVar16 + 1) {
      psVar11 = cmTarget::GetName_abi_cxx11_
                          ((puVar16->_M_t).
                           super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
                           super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                           super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl);
      _Var5 = std::operator==(psVar11,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
      if (_Var5) {
        local_290 = (puVar16->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>.
                    _M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                    super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
        if (local_290 != (cmTarget *)0x0) goto LAB_002533ae;
        break;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar10 = std::operator<<((ostream *)&e,"Cannot specify link libraries for target \"");
    poVar10 = std::operator<<(poVar10,(string *)
                                      (args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start);
    poVar10 = std::operator<<(poVar10,"\" ");
    std::operator<<(poVar10,"which is not built by this project.");
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      PVar7 = cmMakefile::GetPolicyStatus(pcVar1,CMP0016,false);
      if (PVar7 - REQUIRED_IF_USED < 2) {
        poVar10 = std::operator<<((ostream *)&e,"\n");
        cmPolicies::GetRequiredPolicyError_abi_cxx11_
                  ((string *)&tll,(cmPolicies *)&DAT_00000010,id_01);
        std::operator<<(poVar10,(string *)&tll);
        std::__cxx11::string::~string((string *)&tll);
      }
      else {
        if (PVar7 == OLD) goto LAB_00253d53;
        if (PVar7 == WARN) {
          poVar10 = std::operator<<((ostream *)&e,"\n");
          poVar10 = std::operator<<(poVar10,
                                    "CMake does not support this but it used to work accidentally ")
          ;
          poVar10 = std::operator<<(poVar10,"and is being allowed for compatibility.");
          poVar10 = std::operator<<(poVar10,"\n");
          cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&tll,(cmPolicies *)&DAT_00000010,id_00);
          std::operator<<(poVar10,(string *)&tll);
          std::__cxx11::string::~string((string *)&tll);
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)&tll);
          std::__cxx11::string::~string((string *)&tll);
          goto LAB_00253d53;
        }
      }
    }
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&tll);
    std::__cxx11::string::~string((string *)&tll);
    cmSystemTools::s_FatalErrorOccurred = true;
LAB_00253d53:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    return (bool)1;
  }
LAB_002533ae:
  TVar6 = cmTarget::GetType(local_290);
  if (TVar6 == UTILITY) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar7 = cmMakefile::GetPolicyStatus(pcVar1,CMP0039,false);
    if (PVar7 - NEW < 3) {
      pcVar19 = "must";
      t = FATAL_ERROR;
      bVar4 = true;
LAB_0025359f:
      poVar10 = std::operator<<((ostream *)&e,"Utility target \"");
      psVar11 = cmTarget::GetName_abi_cxx11_(local_290);
      poVar10 = std::operator<<(poVar10,(string *)psVar11);
      poVar10 = std::operator<<(poVar10,"\" ");
      poVar10 = std::operator<<(poVar10,pcVar19);
      std::operator<<(poVar10," not be used as the target of a target_link_libraries call.");
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,t,(string *)&tll);
      std::__cxx11::string::~string((string *)&tll);
      if (bVar4) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        return (bool)0;
      }
    }
    else if (PVar7 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&tll,(cmPolicies *)0x27,id);
      poVar10 = std::operator<<((ostream *)&e,(string *)&tll);
      std::operator<<(poVar10,"\n");
      std::__cxx11::string::~string((string *)&tll);
      pcVar19 = "should";
      bVar4 = false;
      t = AUTHOR_WARNING;
      goto LAB_0025359f;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    return (bool)1;
  }
  tll.Target = local_290;
  tll.WarnRemoteInterface = false;
  tll.RejectRemoteLinking = false;
  tll.EncodeRemoteReference = false;
  tll.DirectoryId._M_dataplus._M_p = (pointer)&tll.DirectoryId.field_2;
  tll.DirectoryId._M_string_length = 0;
  tll.DirectoryId.field_2._M_local_buf[0] = '\0';
  tll.Props._M_h._M_buckets = &tll.Props._M_h._M_single_bucket;
  tll.Props._M_h._M_bucket_count = 1;
  tll.Props._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tll.Props._M_h._M_element_count = 0;
  tll.Props._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  tll.Props._M_h._M_rehash_policy._M_next_resize = 0;
  tll.Props._M_h._M_single_bucket = (__node_base_ptr)0x0;
  tll.Makefile = pcVar1;
  pcVar12 = cmTarget::GetMakefile(local_290);
  if (pcVar12 != pcVar1) {
    PVar7 = cmMakefile::GetPolicyStatus(tll.Makefile,CMP0079,false);
    if (PVar7 - NEW < 3) {
      tll.EncodeRemoteReference = true;
    }
    else {
      if (PVar7 != OLD) {
        if (PVar7 != WARN) goto LAB_002536f4;
        tll.WarnRemoteInterface = true;
        tll.RejectRemoteLinking = false;
      }
      tll.RejectRemoteLinking = true;
    }
  }
LAB_002536f4:
  if (tll.EncodeRemoteReference == true) {
    cmMakefile::GetDirectoryId((cmDirectoryId *)&e,tll.Makefile);
    cmStrCat<char_const(&)[4],std::__cxx11::string_const&>
              ((string *)&currentEntry,(char (*) [4])"::@",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
    std::__cxx11::string::operator=((string *)&tll.DirectoryId,(string *)&currentEntry);
    std::__cxx11::string::~string((string *)&currentEntry);
    std::__cxx11::string::~string((string *)&e);
  }
  processCurrentEntry.currentProcessingState = &currentProcessingState;
  currentProcessingState = ProcessingLinkLibraries;
  processCurrentEntry.genexNesting = &genexNesting;
  genexNesting = 0;
  processCurrentEntry.haveLLT = &haveLLT;
  haveLLT = false;
  processCurrentEntry.currentEntry = &currentEntry;
  local_2c0 = 0;
  currentEntry.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  processCurrentEntry.tll = &tll;
  local_2b0 = pcVar1;
  if ((cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::keywords_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::keywords_abi_cxx11_), iVar8 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"LINK_INTERFACE_LIBRARIES",local_288);
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,"INTERFACE",&local_2b1);
    std::__cxx11::string::string<std::allocator<char>>(local_190,"LINK_PUBLIC",&local_2b2);
    std::__cxx11::string::string<std::allocator<char>>(local_170,"PUBLIC",&local_299);
    std::__cxx11::string::string<std::allocator<char>>(local_150,"LINK_PRIVATE",&local_29a);
    std::__cxx11::string::string<std::allocator<char>>(local_130,"PRIVATE",&local_29b);
    std::__cxx11::string::string<std::allocator<char>>(local_110,"debug",&local_29c);
    std::__cxx11::string::string<std::allocator<char>>(local_f0,"optimized",&local_29d);
    std::__cxx11::string::string<std::allocator<char>>(local_d0,"general",&local_29e);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::keywords_abi_cxx11_,&e,local_b0,0,&local_29f,&local_2a0,&local_2a1);
    lVar17 = 0x100;
    do {
      std::__cxx11::string::~string((string *)(&e + lVar17));
      lVar17 = lVar17 + -0x20;
    } while (lVar17 != -0x20);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,
                 &cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                  ::keywords_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::keywords_abi_cxx11_);
  }
  uVar18 = 1;
  do {
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= uVar18) {
      bVar4 = cmTargetLinkLibrariesCommand::anon_class_40_5_a08604cb::operator()
                        (&processCurrentEntry);
      this = local_290;
      pcVar1 = local_2b0;
      if (bVar4) {
        if (haveLLT == true) {
          cmStrCat<char_const(&)[6],char_const*&,char_const(&)[42]>
                    ((string *)&e,(char (*) [6])"The \"",
                     (char **)((anonymous_namespace)::LinkLibraryTypeNames +
                              (local_2c0 & 0xffffffff) * 8),
                     (char (*) [42])"\" argument must be followed by a library.");
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          cmSystemTools::s_FatalErrorOccurred = true;
        }
        PVar7 = cmTarget::GetPolicyStatusCMP0022(this);
        uVar15 = CONCAT44(extraout_var,PVar7);
        if ((PVar7 < NEW) && (currentProcessingState != ProcessingLinkLibraries)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"LINK_INTERFACE_LIBRARIES",local_288);
          local_2c0 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          cVar14 = cmTarget::GetProperty(this,(string *)&e);
          std::__cxx11::string::~string((string *)&e);
          if (cVar14.Value == (string *)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,"LINK_INTERFACE_LIBRARIES",&local_2b1);
            std::__cxx11::string::string<std::allocator<char>>((string *)local_288,"",&local_2b2);
            cmTarget::SetProperty(this,(string *)&e,(string *)local_288);
            std::__cxx11::string::~string((string *)local_288);
            std::__cxx11::string::~string((string *)&e);
          }
        }
        else {
LAB_00253e9b:
          local_2c0 = CONCAT71((int7)((ulong)uVar15 >> 8),1);
        }
      }
      else {
LAB_00253cd4:
        local_2c0 = 0;
      }
LAB_00253ea2:
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&currentEntry);
      anon_unknown.dwarf_800a5c::TLL::~TLL(&tll);
      return (bool)(char)local_2c0;
    }
    sVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::count(&cmTargetLinkLibrariesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                      ::keywords_abi_cxx11_._M_h,pbVar3 + uVar18);
    iVar8 = (int)uVar18;
    if (sVar13 == 0) {
      if (haveLLT == true) {
        haveLLT = false;
        if (currentEntry.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          __assert_fail("!currentEntry",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmTargetLinkLibrariesCommand.cxx"
                        ,0x143,
                        "bool cmTargetLinkLibrariesCommand(const std::vector<std::string> &, cmExecutionStatus &)"
                       );
        }
        bVar4 = anon_unknown.dwarf_800a5c::TLL::HandleLibrary
                          (&tll,currentProcessingState,
                           (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar18,
                           (cmTargetLinkLibraryType)local_2c0);
        local_2c0 = 0;
        if (!bVar4) goto LAB_00253ea2;
      }
      else {
        _e = (pointer)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar18]._M_string_length;
        for (__pos = (pointer)0x0; __pos < _e; __pos = __pos + 1) {
          str = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&e,(size_type)__pos,
                           0xffffffffffffffff);
          bVar4 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0x6a4fd5);
          if (bVar4) {
            genexNesting = genexNesting + 1;
            __pos = __pos + 1;
          }
          else if ((genexNesting != 0) &&
                  (bVar4 = cmHasLiteralPrefix<2ul>(str,(char (*) [2])0x6ba9d1), bVar4)) {
            genexNesting = genexNesting - 1;
          }
        }
        __u = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + uVar18;
        if (currentEntry.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          local_288[0] = (allocator<char>)0x3b;
          cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
                    ((string *)&e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &currentEntry,(char *)local_288,__u);
          std::optional<std::__cxx11::string>::operator=
                    ((optional<std::__cxx11::string> *)&currentEntry,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e);
          std::__cxx11::string::~string((string *)&e);
        }
        else {
          std::optional<std::__cxx11::string>::operator=
                    ((optional<std::__cxx11::string> *)&currentEntry,__u);
        }
        if ((genexNesting == 0) &&
           (bVar4 = cmTargetLinkLibrariesCommand::anon_class_40_5_a08604cb::operator()
                              (&processCurrentEntry), !bVar4)) goto LAB_00253cd4;
      }
    }
    else {
      bVar4 = cmTargetLinkLibrariesCommand::anon_class_40_5_a08604cb::operator()
                        (&processCurrentEntry);
      if (!bVar4) goto LAB_00253cd4;
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar18,
                              "LINK_INTERFACE_LIBRARIES");
      if (bVar4) {
        currentProcessingState = ProcessingPlainLinkInterface;
        if (iVar8 != 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,
                     "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                     ,local_288);
          cmMakefile::IssueMessage(local_2b0,FATAL_ERROR,(string *)&e);
LAB_00253e8e:
          uVar15 = std::__cxx11::string::~string((string *)&e);
          goto LAB_00253e9b;
        }
      }
      else {
        bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar18,"INTERFACE");
        if (bVar4) {
          if (((iVar8 != 1) && (currentProcessingState != ProcessingKeywordLinkInterface)) &&
             ((currentProcessingState & ~ProcessingKeywordLinkInterface) !=
              ProcessingKeywordPublicInterface)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,
                       "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                       ,local_288);
            cmMakefile::IssueMessage(local_2b0,FATAL_ERROR,(string *)&e);
            goto LAB_00253e8e;
          }
          currentProcessingState = ProcessingKeywordLinkInterface;
        }
        else {
          bVar4 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar18,"LINK_PUBLIC")
          ;
          if (bVar4) {
            if (((iVar8 != 1) && (currentProcessingState != ProcessingPlainPrivateInterface)) &&
               (currentProcessingState != ProcessingPlainPublicInterface)) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&e,
                         "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                         ,local_288);
              cmMakefile::IssueMessage(local_2b0,FATAL_ERROR,(string *)&e);
              goto LAB_00253e8e;
            }
            currentProcessingState = ProcessingPlainPublicInterface;
          }
          else {
            bVar4 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar18,"PUBLIC");
            if (bVar4) {
              if (((iVar8 != 1) && (currentProcessingState != ProcessingKeywordLinkInterface)) &&
                 ((currentProcessingState & ~ProcessingKeywordLinkInterface) !=
                  ProcessingKeywordPublicInterface)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,
                           "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                           ,local_288);
                cmMakefile::IssueMessage(local_2b0,FATAL_ERROR,(string *)&e);
                goto LAB_00253e8e;
              }
              currentProcessingState = ProcessingKeywordPublicInterface;
            }
            else {
              bVar4 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar18,
                                      "LINK_PRIVATE");
              if (bVar4) {
                if (((iVar8 != 1) && (currentProcessingState != ProcessingPlainPublicInterface)) &&
                   (currentProcessingState != ProcessingPlainPrivateInterface)) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e,
                             "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                             ,local_288);
                  cmMakefile::IssueMessage(local_2b0,FATAL_ERROR,(string *)&e);
                  goto LAB_00253e8e;
                }
                currentProcessingState = ProcessingPlainPrivateInterface;
              }
              else {
                bVar4 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar18,
                                        "PRIVATE");
                if (bVar4) {
                  if (((iVar8 != 1) && (currentProcessingState != ProcessingKeywordLinkInterface))
                     && ((currentProcessingState & ~ProcessingKeywordLinkInterface) !=
                         ProcessingKeywordPublicInterface)) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&e,
                               "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                               ,local_288);
                    cmMakefile::IssueMessage(local_2b0,FATAL_ERROR,(string *)&e);
                    goto LAB_00253e8e;
                  }
                  currentProcessingState = ProcessingKeywordPrivateInterface;
                }
                else {
                  bVar4 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar18,
                                          "debug");
                  if (bVar4) {
                    if (haveLLT == true) {
                      LinkLibraryTypeSpecifierWarning(local_2b0,(int)local_2c0,1);
                    }
                    uStackY_2e0 = 1;
                  }
                  else {
                    bVar4 = std::operator==((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar18,
                                            "optimized");
                    if (!bVar4) {
                      bVar4 = std::operator==((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar18,
                                              "general");
                      if (bVar4) {
                        if (haveLLT == true) {
                          LinkLibraryTypeSpecifierWarning(local_2b0,(int)local_2c0,0);
                        }
                        haveLLT = true;
                        local_2c0 = 0;
                      }
                      goto LAB_00253b4c;
                    }
                    if (haveLLT == true) {
                      LinkLibraryTypeSpecifierWarning(local_2b0,(int)local_2c0,2);
                    }
                    uStackY_2e0 = 2;
                  }
                  haveLLT = true;
                  local_2c0 = uStackY_2e0;
                }
              }
            }
          }
        }
      }
    }
LAB_00253b4c:
    uVar18 = (ulong)(iVar8 + 1);
  } while( true );
}

Assistant:

bool cmTargetLinkLibrariesCommand(std::vector<std::string> const& args,
                                  cmExecutionStatus& status)
{
  // Must have at least one argument.
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Alias targets cannot be on the LHS of this command.
  if (mf.IsAlias(args[0])) {
    status.SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  cmTarget* target =
    mf.GetCMakeInstance()->GetGlobalGenerator()->FindTarget(args[0]);
  if (!target) {
    for (const auto& importedTarget : mf.GetOwnedImportedTargets()) {
      if (importedTarget->GetName() == args[0]) {
        target = importedTarget.get();
        break;
      }
    }
  }
  if (!target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (mf.GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        mf.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        mf.IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccurred();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (mf.GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
        break;
    }
    if (modal) {
      e << "Utility target \"" << target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      mf.IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  TLL tll(mf, target);

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  ProcessingState currentProcessingState = ProcessingLinkLibraries;

  // Accumulate consectuive non-keyword arguments into one entry in
  // order to handle unquoted generator expressions containing ';'.
  std::size_t genexNesting = 0;
  cm::optional<std::string> currentEntry;
  auto processCurrentEntry = [&]() -> bool {
    // FIXME: Warn about partial genex if genexNesting > 0?
    genexNesting = 0;
    if (currentEntry) {
      assert(!haveLLT);
      if (!tll.HandleLibrary(currentProcessingState, *currentEntry,
                             GENERAL_LibraryType)) {
        return false;
      }
      currentEntry = cm::nullopt;
    }
    return true;
  };
  auto extendCurrentEntry = [&currentEntry](std::string const& arg) {
    if (currentEntry) {
      currentEntry = cmStrCat(*currentEntry, ';', arg);
    } else {
      currentEntry = arg;
    }
  };

  // Keep this list in sync with the keyword dispatch below.
  static std::unordered_set<std::string> const keywords{
    "LINK_INTERFACE_LIBRARIES",
    "INTERFACE",
    "LINK_PUBLIC",
    "PUBLIC",
    "LINK_PRIVATE",
    "PRIVATE",
    "debug",
    "optimized",
    "general",
  };

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (keywords.count(args[i])) {
      // A keyword argument terminates any accumulated partial genex.
      if (!processCurrentEntry()) {
        return false;
      }

      // Process this keyword argument.
      if (args[i] == "LINK_INTERFACE_LIBRARIES") {
        currentProcessingState = ProcessingPlainLinkInterface;
        if (i != 1) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_INTERFACE_LIBRARIES option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
      } else if (args[i] == "INTERFACE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordLinkInterface;
      } else if (args[i] == "LINK_PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPrivateInterface &&
            currentProcessingState != ProcessingPlainPublicInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPublicInterface;
      } else if (args[i] == "PUBLIC") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPublicInterface;
      } else if (args[i] == "LINK_PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingPlainPublicInterface &&
            currentProcessingState != ProcessingPlainPrivateInterface) {
          mf.IssueMessage(
            MessageType::FATAL_ERROR,
            "The LINK_PUBLIC or LINK_PRIVATE option must appear as the "
            "second argument, just after the target name.");
          return true;
        }
        currentProcessingState = ProcessingPlainPrivateInterface;
      } else if (args[i] == "PRIVATE") {
        if (i != 1 &&
            currentProcessingState != ProcessingKeywordPrivateInterface &&
            currentProcessingState != ProcessingKeywordPublicInterface &&
            currentProcessingState != ProcessingKeywordLinkInterface) {
          mf.IssueMessage(MessageType::FATAL_ERROR,
                          "The INTERFACE, PUBLIC or PRIVATE option must "
                          "appear as the second argument, just after the "
                          "target name.");
          return true;
        }
        currentProcessingState = ProcessingKeywordPrivateInterface;
      } else if (args[i] == "debug") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, DEBUG_LibraryType);
        }
        llt = DEBUG_LibraryType;
        haveLLT = true;
      } else if (args[i] == "optimized") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, OPTIMIZED_LibraryType);
        }
        llt = OPTIMIZED_LibraryType;
        haveLLT = true;
      } else if (args[i] == "general") {
        if (haveLLT) {
          LinkLibraryTypeSpecifierWarning(mf, llt, GENERAL_LibraryType);
        }
        llt = GENERAL_LibraryType;
        haveLLT = true;
      }
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      assert(!currentEntry);
      if (!tll.HandleLibrary(currentProcessingState, args[i], llt)) {
        return false;
      }
      llt = GENERAL_LibraryType;
    } else {
      // Track the genex nesting level.
      {
        cm::string_view arg = args[i];
        for (std::string::size_type pos = 0; pos < arg.size(); ++pos) {
          cm::string_view cur = arg.substr(pos);
          if (cmHasLiteralPrefix(cur, "$<")) {
            ++genexNesting;
            ++pos;
          } else if (genexNesting > 0 && cmHasLiteralPrefix(cur, ">")) {
            --genexNesting;
          }
        }
      }

      // Accumulate this argument in the current entry.
      extendCurrentEntry(args[i]);

      // Process this entry if it does not end inside a genex.
      if (genexNesting == 0) {
        if (!processCurrentEntry()) {
          return false;
        }
      }
    }
  }

  // Process the last accumulated partial genex, if any.
  if (!processCurrentEntry()) {
    return false;
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    mf.IssueMessage(MessageType::FATAL_ERROR,
                    cmStrCat("The \"", LinkLibraryTypeNames[llt],
                             "\" argument must be followed by a library."));
    cmSystemTools::SetFatalErrorOccurred();
  }

  const cmPolicies::PolicyStatus policy22Status =
    target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      currentProcessingState != ProcessingLinkLibraries &&
      !target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}